

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreState.h
# Opt level: O3

bool __thiscall
axl::sl::BoyerMooreTextState::create
          (BoyerMooreTextState *this,StringRef *pattern,uint64_t charOffset,uint64_t binOffset)

{
  bool bVar1;
  UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap> local_38;
  CountingEmitter local_30;
  
  local_30.m_length = 0;
  local_30.m_replacement = 0xfffd;
  local_38.m_state = 0;
  local_38.m_cp = 0;
  enc::Utf8Decoder::
  decodeImpl<axl::enc::Convert<axl::enc::Utf32,axl::enc::Utf8,axl::sl::Nop<wchar_t,wchar_t>,axl::enc::Utf8Decoder>::CountingEmitter>
            ((Dfa *)&local_38,&local_30,pattern->m_p,pattern->m_p + pattern->m_length);
  bVar1 = create(this,pattern->m_length,charOffset,binOffset);
  return bVar1;
}

Assistant:

bool
	create(
		const sl::StringRef& pattern,
		uint64_t charOffset,
		uint64_t binOffset
	) {
		size_t patternLength = enc::Convert<enc::Utf32, enc::Utf8>::calcRequiredLength(pattern.cp(), pattern.getEnd());
		return create(pattern.getLength(), charOffset, binOffset);
	}